

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O0

string * getTargetLanguageCode(string *__return_storage_ptr__,Parser *PhParser,string *TgtLang)

{
  int iVar1;
  Program *pPVar2;
  char *pcVar3;
  string *psVar4;
  ostream *poVar5;
  allocator local_401;
  string local_400;
  undefined1 local_3e0 [8];
  OMPCG OMP;
  string local_308;
  undefined1 local_2e8 [8];
  GraphCodeGen Gen;
  undefined1 local_148 [8];
  Sema S;
  string *TgtLang_local;
  Parser *PhParser_local;
  string *TgtCode;
  
  S.ElementInfo.Syms._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)TgtLang;
  phaeton::Sema::Sema((Sema *)local_148);
  pPVar2 = phaeton::Parser::getAST(PhParser);
  phaeton::ASTVisitor::visitProgram((ASTVisitor *)local_148,pPVar2);
  Gen.ExprGraphs._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"",
             (allocator *)
             ((long)&Gen.ExprGraphs._M_t._M_impl.super__Rb_tree_header._M_node_count + 2));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&Gen.ExprGraphs._M_t._M_impl.super__Rb_tree_header._M_node_count + 2));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(pcVar3,"OPENMP");
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_308,"omp_func",
               (allocator *)(OMP.ElementIndex.field_2._M_local_buf + 0xf));
    phaeton::GraphCodeGen::GraphCodeGen((GraphCodeGen *)local_2e8,(Sema *)local_148,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator
              ((allocator<char> *)(OMP.ElementIndex.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_400,"float",&local_401);
    phaeton::OMPCG::OMPCG
              ((OMPCG *)local_3e0,(CodeGen *)local_2e8,true,false,false,false,false,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    pPVar2 = phaeton::Parser::getAST(PhParser);
    phaeton::OMPCG::genCode((OMPCG *)local_3e0,pPVar2);
    psVar4 = phaeton::OMPCG::getCode_abi_cxx11_((OMPCG *)local_3e0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar4);
    phaeton::OMPCG::~OMPCG((OMPCG *)local_3e0);
    phaeton::GraphCodeGen::~GraphCodeGen((GraphCodeGen *)local_2e8);
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"NUMPY");
    if (iVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ph-opt");
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = std::operator<<(poVar5,"\x1b[31m wip: \x1b[0m");
      std::operator<<(poVar5,"Target language not support yet\n");
      exit(0);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"OPENCL");
    if (iVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ph-opt");
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = std::operator<<(poVar5,"\x1b[31m wip: \x1b[0m");
      std::operator<<(poVar5,"Target language not support yet\n");
      exit(0);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"CUDA");
    if (iVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ph-opt");
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = std::operator<<(poVar5,"\x1b[31m wip: \x1b[0m");
      std::operator<<(poVar5,"Target language not support yet\n");
      exit(0);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"BANG");
    if (iVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ph-opt");
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = std::operator<<(poVar5,"\x1b[31m wip: \x1b[0m");
      std::operator<<(poVar5,"Target language not support yet\n");
      exit(0);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"CCE");
    if (iVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ph-opt");
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = std::operator<<(poVar5,"\x1b[31m wip: \x1b[0m");
      std::operator<<(poVar5,"Target language not support yet\n");
      exit(0);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar3,"TPU");
    if (iVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ph-opt");
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = std::operator<<(poVar5,"\x1b[31m wip: \x1b[0m");
      std::operator<<(poVar5,"Target language not support yet\n");
      exit(0);
    }
  }
  Gen.ExprGraphs._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  phaeton::Sema::~Sema((Sema *)local_148);
  return __return_storage_ptr__;
}

Assistant:

std::string getTargetLanguageCode(const Parser &PhParser,
                                  const std::string &TgtLang) {
  Sema S;
  S.visitProgram(PhParser.getAST());
  std::string TgtCode = "";
  if (!std::strcmp(TgtLang.c_str(), "OPENMP")) {
    GraphCodeGen Gen(&S, "omp_func");
    // FIXME: CodeGen mode must be sync with a specific codegen, i.e.
    // if we omit the function name, the wrapper caller will be wrong.
    OMPCG OMP(&Gen, true);
    OMP.genCode(PhParser.getAST());
    TgtCode = OMP.getCode();
  } else if (!std::strcmp(TgtLang.c_str(), "NUMPY")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "OPENCL")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "CUDA")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "BANG")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "CCE")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "TPU")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  }
  return TgtCode;
}